

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O3

string * __thiscall
TypeOpCallother::getOperatorName_abi_cxx11_
          (string *__return_storage_ptr__,TypeOpCallother *this,PcodeOp *op)

{
  Architecture *pAVar1;
  pointer ppUVar2;
  UserPcodeOp *pUVar3;
  pointer pcVar4;
  ulong uVar5;
  ostream *poVar6;
  ostringstream res;
  char local_1b9;
  char *local_1b8;
  long local_1b0;
  char local_1a8 [16];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  if (op->parent != (BlockBasic *)0x0) {
    pAVar1 = op->parent->data->glb;
    uVar5 = (ulong)(int)((*(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                           _M_impl.super__Vector_impl_data._M_start)->loc).offset;
    ppUVar2 = (pAVar1->userops).useroplist.
              super__Vector_base<UserPcodeOp_*,_std::allocator<UserPcodeOp_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((uVar5 < (ulong)((long)(pAVar1->userops).useroplist.
                               super__Vector_base<UserPcodeOp_*,_std::allocator<UserPcodeOp_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppUVar2 >> 3)) &&
       (pUVar3 = ppUVar2[uVar5], pUVar3 != (UserPcodeOp *)0x0)) {
      (*pUVar3->_vptr_UserPcodeOp[2])(__return_storage_ptr__,pUVar3,op);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  pcVar4 = (this->super_TypeOp).name._M_dataplus._M_p;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar4,pcVar4 + (this->super_TypeOp).name._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1b8,local_1b0);
  local_1b9 = '[';
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_1b9,1);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  Varnode::printRaw(*(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                     super__Vector_impl_data._M_start,(ostream *)local_198);
  local_1b8 = (char *)CONCAT71(local_1b8._1_7_,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,(char *)&local_1b8,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string TypeOpCallother::getOperatorName(const PcodeOp *op) const

{
  const BlockBasic *bb = op->getParent();
  if (bb != (BlockBasic *)0) {
   Architecture *glb = bb->getFuncdata()->getArch();
   int4 index = op->getIn(0)->getOffset();
    UserPcodeOp *userop = glb->userops.getOp(index);
    if (userop != (UserPcodeOp *)0)
      return userop->getOperatorName(op);
  }
  ostringstream res;
  res << TypeOp::getOperatorName(op) << '[';
  op->getIn(0)->printRaw(res);
  res << ']';
  return res.str();
}